

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O1

void __thiscall GraphTestRuleVariablesInScope::Run(GraphTestRuleVariablesInScope *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Edge *this_00;
  Test *this_01;
  int iVar2;
  Node *pNVar3;
  string local_48;
  
  iVar2 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  depfile = x\n  command = depfile is $depfile\nbuild out: r in\n",
              (ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"out","");
    pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_48);
    this_00 = pNVar3->in_edge_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    this_01 = g_current_test;
    Edge::EvaluateCommand_abi_cxx11_(&local_48,this_00,false);
    iVar2 = std::__cxx11::string::compare((char *)&local_48);
    testing::Test::Check
              (this_01,iVar2 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x13c,"\"depfile is x\" == edge->EvaluateCommand()");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(GraphTest, RuleVariablesInScope) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule r\n"
"  depfile = x\n"
"  command = depfile is $depfile\n"
"build out: r in\n"));
  Edge* edge = GetNode("out")->in_edge();
  EXPECT_EQ("depfile is x", edge->EvaluateCommand());
}